

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config_app.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  Option *pOVar2;
  ostream *poVar3;
  allocator local_5a1;
  double value;
  int v;
  int count;
  string local_590;
  string file;
  string local_550;
  string local_530;
  string local_510;
  string local_4f0;
  string local_4d0;
  string local_4b0;
  string local_490;
  string local_470;
  string local_450;
  string local_430;
  string local_410;
  string local_3f0;
  string local_3d0;
  string local_3b0;
  App app;
  
  std::__cxx11::string::string
            ((string *)&local_3b0,"configuration print example",(allocator *)&file);
  std::__cxx11::string::string((string *)&local_3d0,"",(allocator *)&local_590);
  CLI::App::App(&app,&local_3b0,&local_3d0);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::__cxx11::string::~string((string *)&local_3b0);
  std::__cxx11::string::string((string *)&local_3f0,"-p,--print",(allocator *)&file);
  pOVar2 = CLI::App::add_flag<const_char[29],_(CLI::detail::enabler)0>
                     (&app,&local_3f0,(char (*) [29])"Print configuration and exit");
  (pOVar2->super_OptionBase<CLI::Option>).configurable_ = false;
  std::__cxx11::string::~string((string *)&local_3f0);
  file._M_dataplus._M_p = (pointer)&file.field_2;
  file._M_string_length = 0;
  file.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&local_410,"-f,--file,file",(allocator *)&local_590);
  std::__cxx11::string::string((string *)&local_430,"File name",(allocator *)&value);
  pOVar2 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     (&app,&local_410,&file,&local_430);
  pOVar2 = CLI::Option::capture_default_str(pOVar2);
  pOVar2->run_callback_for_default_ = true;
  std::__cxx11::string::~string((string *)&local_430);
  std::__cxx11::string::~string((string *)&local_410);
  count = 0;
  std::__cxx11::string::string((string *)&local_450,"-c,--count",(allocator *)&local_590);
  std::__cxx11::string::string((string *)&local_470,"Counter",(allocator *)&value);
  pOVar2 = CLI::App::add_option<int,_int,_(CLI::detail::enabler)0>
                     (&app,&local_450,&count,&local_470);
  CLI::Option::capture_default_str(pOVar2);
  std::__cxx11::string::~string((string *)&local_470);
  std::__cxx11::string::~string((string *)&local_450);
  v = 0;
  std::__cxx11::string::string((string *)&local_490,"--flag",(allocator *)&local_590);
  std::__cxx11::string::string
            ((string *)&local_4b0,"Some flag that can be passed multiple times",(allocator *)&value)
  ;
  pOVar2 = CLI::App::add_flag<int,_(CLI::detail::enabler)0>(&app,&local_490,&v,&local_4b0);
  CLI::Option::capture_default_str(pOVar2);
  std::__cxx11::string::~string((string *)&local_4b0);
  std::__cxx11::string::~string((string *)&local_490);
  value = 0.0;
  std::__cxx11::string::string((string *)&local_4d0,"-d,--double",(allocator *)&local_590);
  std::__cxx11::string::string((string *)&local_4f0,"Some Value",&local_5a1);
  pOVar2 = CLI::App::add_option<double,_double,_(CLI::detail::enabler)0>
                     (&app,&local_4d0,&value,&local_4f0);
  CLI::Option::capture_default_str(pOVar2);
  std::__cxx11::string::~string((string *)&local_4f0);
  std::__cxx11::string::~string((string *)&local_4d0);
  std::dynamic_pointer_cast<CLI::ConfigBase,CLI::Config>((shared_ptr<CLI::Config> *)&local_590);
  local_590._M_dataplus._M_p[0x25] = '\"';
  local_590._M_dataplus._M_p[0x26] = '\"';
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_590._M_string_length);
  CLI::App::parse_char_t<char>(&app,argc,argv);
  std::__cxx11::string::string((string *)&local_510,"--print",(allocator *)&local_590);
  pOVar2 = CLI::App::get_option(&app,&local_510);
  bVar1 = CLI::Option::as<bool>(pOVar2);
  std::__cxx11::string::~string((string *)&local_510);
  if (bVar1) {
    CLI::App::config_to_str_abi_cxx11_(&local_590,&app,true,false);
    std::operator<<((ostream *)&std::cout,(string *)&local_590);
    std::__cxx11::string::~string((string *)&local_590);
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,"Working on file: ");
    poVar3 = std::operator<<(poVar3,(string *)&file);
    poVar3 = std::operator<<(poVar3,", direct count: ");
    std::__cxx11::string::string((string *)&local_530,"--file",(allocator *)&local_590);
    CLI::App::count(&app,&local_530);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    poVar3 = std::operator<<(poVar3,", opt count: ");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::operator<<(poVar3,'\n');
    std::__cxx11::string::~string((string *)&local_530);
    poVar3 = std::operator<<((ostream *)&std::cout,"Working on count: ");
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,count);
    poVar3 = std::operator<<(poVar3,", direct count: ");
    std::__cxx11::string::string((string *)&local_550,"--count",(allocator *)&local_590);
    CLI::App::count(&app,&local_550);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    poVar3 = std::operator<<(poVar3,", opt count: ");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::operator<<(poVar3,'\n');
    std::__cxx11::string::~string((string *)&local_550);
    poVar3 = std::operator<<((ostream *)&std::cout,"Received flag: ");
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,v);
    poVar3 = std::operator<<(poVar3," (");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::operator<<(poVar3,") times\n");
    std::operator<<((ostream *)&std::cout,"Some value: ");
    poVar3 = std::ostream::_M_insert<double>(value);
    std::operator<<(poVar3,'\n');
  }
  std::__cxx11::string::~string((string *)&file);
  CLI::App::~App(&app);
  return 0;
}

Assistant:

int main(int argc, char **argv) {

    CLI::App app("configuration print example");

    app.add_flag("-p,--print", "Print configuration and exit")->configurable(false);  // NEW: print flag

    std::string file;
    CLI::Option *opt = app.add_option("-f,--file,file", file, "File name")
                           ->capture_default_str()
                           ->run_callback_for_default();  // NEW: capture_default_str()

    int count{0};
    CLI::Option *copt =
        app.add_option("-c,--count", count, "Counter")->capture_default_str();  // NEW: capture_default_str()

    int v{0};
    CLI::Option *flag = app.add_flag("--flag", v, "Some flag that can be passed multiple times")
                            ->capture_default_str();  // NEW: capture_default_str()

    double value{0.0};                                                          // = 3.14;
    app.add_option("-d,--double", value, "Some Value")->capture_default_str();  // NEW: capture_default_str()

    app.get_config_formatter_base()->quoteCharacter('"', '"');

    CLI11_PARSE(app, argc, argv);

    if(app.get_option("--print")->as<bool>()) {  // NEW: print configuration and exit
        std::cout << app.config_to_str(true, false);
        return 0;
    }

    std::cout << "Working on file: " << file << ", direct count: " << app.count("--file")
              << ", opt count: " << opt->count() << '\n';
    std::cout << "Working on count: " << count << ", direct count: " << app.count("--count")
              << ", opt count: " << copt->count() << '\n';
    std::cout << "Received flag: " << v << " (" << flag->count() << ") times\n";
    std::cout << "Some value: " << value << '\n';

    return 0;
}